

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * sqlite3KeyInfoFromExprList(Parse *pParse,ExprList *pList,int iStart,int nExtra)

{
  int iVar1;
  KeyInfo *pKVar2;
  CollSeq *pCVar3;
  int local_44;
  int i;
  sqlite3 *db;
  ExprList_item *pItem;
  KeyInfo *pInfo;
  int nExpr;
  int nExtra_local;
  int iStart_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  iVar1 = pList->nExpr;
  pKVar2 = sqlite3KeyInfoAlloc(pParse->db,iVar1 - iStart,nExtra + 1);
  if (pKVar2 != (KeyInfo *)0x0) {
    db = (sqlite3 *)(pList->a + iStart);
    for (local_44 = iStart; local_44 < iVar1; local_44 = local_44 + 1) {
      pCVar3 = sqlite3ExprNNCollSeq(pParse,(Expr *)db->pVfs);
      pKVar2->aColl[local_44 - iStart] = pCVar3;
      pKVar2->aSortOrder[local_44 - iStart] = *(u8 *)&db->mutex;
      db = (sqlite3 *)&db->aDb;
    }
  }
  return pKVar2;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoFromExprList(
  Parse *pParse,       /* Parsing context */
  ExprList *pList,     /* Form the KeyInfo object from this ExprList */
  int iStart,          /* Begin with this column of pList */
  int nExtra           /* Add this many extra columns to the end */
){
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3KeyInfoAlloc(db, nExpr-iStart, nExtra+1);
  if( pInfo ){
    assert( sqlite3KeyInfoIsWriteable(pInfo) );
    for(i=iStart, pItem=pList->a+iStart; i<nExpr; i++, pItem++){
      pInfo->aColl[i-iStart] = sqlite3ExprNNCollSeq(pParse, pItem->pExpr);
      pInfo->aSortOrder[i-iStart] = pItem->sortOrder;
    }
  }
  return pInfo;
}